

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_cpp_generator.cc
# Opt level: O0

string * __thiscall
t_cpp_generator::type_name_abi_cxx11_
          (string *__return_storage_ptr__,t_cpp_generator *this,t_type *ttype,bool in_typedef,
          bool arg)

{
  bool bVar1;
  uint uVar2;
  t_base tVar3;
  int iVar4;
  pointer ppVar5;
  t_type *ptVar6;
  t_program *this_00;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c8;
  allocator local_3a1;
  string local_3a0;
  string local_380;
  string local_360;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_340;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_320;
  t_program *local_300;
  t_program *program;
  string pname;
  string class_prefix;
  string local_298;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  t_type *local_238;
  t_list *tlist;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  t_type *local_1d0;
  t_set *tset;
  string local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  t_map *local_108;
  t_map *tmap;
  t_container *local_e0;
  t_container *tcontainer;
  string cname;
  _Self local_90 [3];
  allocator local_71;
  key_type local_70;
  _Self local_50;
  iterator it;
  string bname;
  bool arg_local;
  bool in_typedef_local;
  t_type *ttype_local;
  t_cpp_generator *this_local;
  
  uVar2 = (*(ttype->super_t_doc)._vptr_t_doc[5])();
  if ((uVar2 & 1) == 0) {
    uVar2 = (*(ttype->super_t_doc)._vptr_t_doc[0xd])();
    if ((uVar2 & 1) == 0) {
      std::__cxx11::string::string((string *)(pname.field_2._M_local_buf + 8));
      if ((in_typedef) &&
         ((uVar2 = (*(ttype->super_t_doc)._vptr_t_doc[0xb])(), (uVar2 & 1) != 0 ||
          (uVar2 = (*(ttype->super_t_doc)._vptr_t_doc[0xc])(), (uVar2 & 1) != 0)))) {
        std::__cxx11::string::operator=((string *)(pname.field_2._M_local_buf + 8),"class ");
      }
      std::__cxx11::string::string((string *)&program);
      this_00 = t_type::get_program(ttype);
      local_300 = this_00;
      if ((this_00 == (t_program *)0x0) ||
         (this_00 == (this->super_t_oop_generator).super_t_generator.program_)) {
        iVar4 = (*(ttype->super_t_doc)._vptr_t_doc[3])();
        std::operator+(&local_3c8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&pname.field_2 + 8),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(extraout_var_00,iVar4));
        std::__cxx11::string::operator=((string *)&program,(string *)&local_3c8);
        std::__cxx11::string::~string((string *)&local_3c8);
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_3a0,"cpp",&local_3a1);
        t_program::get_namespace(&local_380,this_00,&local_3a0);
        namespace_prefix(&local_360,this,&local_380);
        std::operator+(&local_340,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&pname.field_2 + 8),&local_360);
        iVar4 = (*(ttype->super_t_doc)._vptr_t_doc[3])();
        std::operator+(&local_320,&local_340,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(extraout_var,iVar4));
        std::__cxx11::string::operator=((string *)&program,(string *)&local_320);
        std::__cxx11::string::~string((string *)&local_320);
        std::__cxx11::string::~string((string *)&local_340);
        std::__cxx11::string::~string((string *)&local_360);
        std::__cxx11::string::~string((string *)&local_380);
        std::__cxx11::string::~string((string *)&local_3a0);
        std::allocator<char>::~allocator((allocator<char> *)&local_3a1);
      }
      uVar2 = (*(ttype->super_t_doc)._vptr_t_doc[10])();
      if (((uVar2 & 1) != 0) && ((this->gen_pure_enums_ & 1U) == 0)) {
        std::__cxx11::string::operator+=((string *)&program,"::type");
      }
      if (arg) {
        bVar1 = is_complex_type(this,ttype);
        if (bVar1) {
          std::operator+(&local_3e8,"const ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &program);
          std::operator+(__return_storage_ptr__,&local_3e8,"&");
          std::__cxx11::string::~string((string *)&local_3e8);
        }
        else {
          std::operator+(__return_storage_ptr__,"const ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &program);
        }
      }
      else {
        std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&program);
      }
      std::__cxx11::string::~string((string *)&program);
      std::__cxx11::string::~string((string *)(pname.field_2._M_local_buf + 8));
    }
    else {
      std::__cxx11::string::string((string *)&tcontainer);
      local_e0 = (t_container *)ttype;
      bVar1 = t_container::has_cpp_name((t_container *)ttype);
      if (bVar1) {
        t_container::get_cpp_name_abi_cxx11_((string *)&tmap,local_e0);
        std::__cxx11::string::operator=((string *)&tcontainer,(string *)&tmap);
        std::__cxx11::string::~string((string *)&tmap);
      }
      else {
        uVar2 = (*(ttype->super_t_doc)._vptr_t_doc[0x10])();
        if ((uVar2 & 1) == 0) {
          uVar2 = (*(ttype->super_t_doc)._vptr_t_doc[0xf])();
          if ((uVar2 & 1) == 0) {
            uVar2 = (*(ttype->super_t_doc)._vptr_t_doc[0xe])();
            if ((uVar2 & 1) != 0) {
              local_238 = ttype;
              ptVar6 = t_list::get_elem_type((t_list *)ttype);
              type_name_abi_cxx11_(&local_298,this,ptVar6,in_typedef,false);
              std::operator+(&local_278,"std::vector<",&local_298);
              std::operator+(&local_258,&local_278,"> ");
              std::__cxx11::string::operator=((string *)&tcontainer,(string *)&local_258);
              std::__cxx11::string::~string((string *)&local_258);
              std::__cxx11::string::~string((string *)&local_278);
              std::__cxx11::string::~string((string *)&local_298);
            }
          }
          else {
            local_1d0 = ttype;
            ptVar6 = t_set::get_elem_type((t_set *)ttype);
            type_name_abi_cxx11_((string *)&tlist,this,ptVar6,in_typedef,false);
            std::operator+(&local_210,"std::set<",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &tlist);
            std::operator+(&local_1f0,&local_210,"> ");
            std::__cxx11::string::operator=((string *)&tcontainer,(string *)&local_1f0);
            std::__cxx11::string::~string((string *)&local_1f0);
            std::__cxx11::string::~string((string *)&local_210);
            std::__cxx11::string::~string((string *)&tlist);
          }
        }
        else {
          local_108 = (t_map *)ttype;
          ptVar6 = t_map::get_key_type((t_map *)ttype);
          type_name_abi_cxx11_(&local_1a8,this,ptVar6,in_typedef,false);
          std::operator+(&local_188,"std::map<",&local_1a8);
          std::operator+(&local_168,&local_188,", ");
          ptVar6 = t_map::get_val_type(local_108);
          type_name_abi_cxx11_((string *)&tset,this,ptVar6,in_typedef,false);
          std::operator+(&local_148,&local_168,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tset)
          ;
          std::operator+(&local_128,&local_148,"> ");
          std::__cxx11::string::operator=((string *)&tcontainer,(string *)&local_128);
          std::__cxx11::string::~string((string *)&local_128);
          std::__cxx11::string::~string((string *)&local_148);
          std::__cxx11::string::~string((string *)&tset);
          std::__cxx11::string::~string((string *)&local_168);
          std::__cxx11::string::~string((string *)&local_188);
          std::__cxx11::string::~string((string *)&local_1a8);
        }
      }
      if (arg) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&class_prefix.field_2 + 8),"const ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &tcontainer);
        std::operator+(__return_storage_ptr__,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&class_prefix.field_2 + 8),"&");
        std::__cxx11::string::~string((string *)(class_prefix.field_2._M_local_buf + 8));
      }
      else {
        std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&tcontainer);
      }
      std::__cxx11::string::~string((string *)&tcontainer);
    }
  }
  else {
    tVar3 = t_base_type::get_base((t_base_type *)ttype);
    base_type_name_abi_cxx11_((string *)&it,this,tVar3);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_70,"cpp.type",&local_71);
    local_50._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::find(&ttype->annotations_,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::allocator<char>::~allocator((allocator<char> *)&local_71);
    local_90[0]._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::end(&ttype->annotations_);
    bVar1 = std::operator!=(&local_50,local_90);
    if (bVar1) {
      ppVar5 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator->(&local_50);
      std::__cxx11::string::operator=((string *)&it,(string *)&ppVar5->second);
    }
    if (arg) {
      tVar3 = t_base_type::get_base((t_base_type *)ttype);
      if (tVar3 == TYPE_STRING) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&cname.field_2 + 8),"const ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&it);
        std::operator+(__return_storage_ptr__,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&cname.field_2 + 8),"&");
        std::__cxx11::string::~string((string *)(cname.field_2._M_local_buf + 8));
      }
      else {
        std::operator+(__return_storage_ptr__,"const ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&it);
      }
    }
    else {
      std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&it);
    }
    std::__cxx11::string::~string((string *)&it);
  }
  return __return_storage_ptr__;
}

Assistant:

string t_cpp_generator::type_name(t_type* ttype, bool in_typedef, bool arg) {
  if (ttype->is_base_type()) {
    string bname = base_type_name(((t_base_type*)ttype)->get_base());
    std::map<string, string>::iterator it = ttype->annotations_.find("cpp.type");
    if (it != ttype->annotations_.end()) {
      bname = it->second;
    }

    if (!arg) {
      return bname;
    }

    if (((t_base_type*)ttype)->get_base() == t_base_type::TYPE_STRING) {
      return "const " + bname + "&";
    } else {
      return "const " + bname;
    }
  }

  // Check for a custom overloaded C++ name
  if (ttype->is_container()) {
    string cname;

    t_container* tcontainer = (t_container*)ttype;
    if (tcontainer->has_cpp_name()) {
      cname = tcontainer->get_cpp_name();
    } else if (ttype->is_map()) {
      t_map* tmap = (t_map*)ttype;
      cname = "std::map<" + type_name(tmap->get_key_type(), in_typedef) + ", "
              + type_name(tmap->get_val_type(), in_typedef) + "> ";
    } else if (ttype->is_set()) {
      t_set* tset = (t_set*)ttype;
      cname = "std::set<" + type_name(tset->get_elem_type(), in_typedef) + "> ";
    } else if (ttype->is_list()) {
      t_list* tlist = (t_list*)ttype;
      cname = "std::vector<" + type_name(tlist->get_elem_type(), in_typedef) + "> ";
    }

    if (arg) {
      return "const " + cname + "&";
    } else {
      return cname;
    }
  }

  string class_prefix;
  if (in_typedef && (ttype->is_struct() || ttype->is_xception())) {
    class_prefix = "class ";
  }

  // Check if it needs to be namespaced
  string pname;
  t_program* program = ttype->get_program();
  if (program != nullptr && program != program_) {
    pname = class_prefix + namespace_prefix(program->get_namespace("cpp")) + ttype->get_name();
  } else {
    pname = class_prefix + ttype->get_name();
  }

  if (ttype->is_enum() && !gen_pure_enums_) {
    pname += "::type";
  }

  if (arg) {
    if (is_complex_type(ttype)) {
      return "const " + pname + "&";
    } else {
      return "const " + pname;
    }
  } else {
    return pname;
  }
}